

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

bam_plp_t bam_plp_init(bam_plp_auto_f func,void *data)

{
  int iVar1;
  int iVar2;
  bam_plp_t p_Var3;
  mempool_t *pmVar4;
  lbnode_t *plVar5;
  bam1_t *pbVar6;
  
  p_Var3 = (bam_plp_t)calloc(1,0x70);
  pmVar4 = (mempool_t *)calloc(1,0x18);
  p_Var3->mp = pmVar4;
  iVar1 = pmVar4->cnt;
  pmVar4->cnt = iVar1 + 1;
  iVar2 = pmVar4->n;
  if ((long)iVar2 == 0) {
    plVar5 = (lbnode_t *)calloc(1,0x58);
  }
  else {
    pmVar4->n = iVar2 + -1;
    plVar5 = pmVar4->buf[(long)iVar2 + -1];
  }
  p_Var3->tail = plVar5;
  p_Var3->head = plVar5;
  pmVar4->cnt = iVar1 + 2;
  iVar1 = pmVar4->n;
  if ((long)iVar1 == 0) {
    plVar5 = (lbnode_t *)calloc(1,0x58);
  }
  else {
    pmVar4->n = iVar1 + -1;
    plVar5 = pmVar4->buf[(long)iVar1 + -1];
  }
  p_Var3->dummy = plVar5;
  p_Var3->max_tid = -1;
  p_Var3->max_pos = -1;
  p_Var3->maxcnt = 8000;
  if (func != (bam_plp_auto_f)0x0) {
    p_Var3->func = func;
    p_Var3->data = data;
    pbVar6 = (bam1_t *)calloc(1,0x38);
    p_Var3->b = pbVar6;
  }
  return p_Var3;
}

Assistant:

bam_plp_t bam_plp_init(bam_plp_auto_f func, void *data)
{
    bam_plp_t iter;
    iter = (bam_plp_t)calloc(1, sizeof(struct __bam_plp_t));
    iter->mp = mp_init();
    iter->head = iter->tail = mp_alloc(iter->mp);
    iter->dummy = mp_alloc(iter->mp);
    iter->max_tid = iter->max_pos = -1;
    iter->maxcnt = 8000;
    if (func) {
        iter->func = func;
        iter->data = data;
        iter->b = bam_init1();
    }
    return iter;
}